

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceModel.cpp
# Opt level: O2

void __thiscall
SequenceModel::replaceData
          (SequenceModel *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer puVar1;
  pointer puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar3;
  PermanentEditor ctx;
  PermanentEditor PStack_38;
  
  Module::permanentEdit(&PStack_38,(this->super_GraphModel).mModule);
  this_00 = trackerboy::Sequence::data(this->mSequence);
  puVar1 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,data);
  Module::PermanentEditor::~PermanentEditor(&PStack_38);
  GraphModel::dataChanged(&this->super_GraphModel);
  lVar3 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((long)puVar2 - (long)puVar1 != lVar3) {
    GraphModel::countChanged(&this->super_GraphModel,(int)lVar3);
  }
  return;
}

Assistant:

void SequenceModel::replaceData(std::vector<uint8_t> const& data) {
    size_t oldsize;
    {
        auto ctx = mModule.permanentEdit();
        auto &seqdata = mSequence->data();
        oldsize = seqdata.size();
        seqdata = data;
    }

    emit dataChanged();

    if (oldsize != data.size()) {
        emit countChanged((int)data.size());
    }
}